

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

xmlChar * xmlCatalogSGMLResolve(xmlCatalogPtr catal,xmlChar *pubID,xmlChar *sysID)

{
  xmlChar *pxVar1;
  void *pvVar2;
  
  if (catal->sgml != (xmlHashTablePtr)0x0) {
    if ((pubID != (xmlChar *)0x0) &&
       (pxVar1 = xmlCatalogGetSGMLPublic(catal->sgml,pubID), pxVar1 != (xmlChar *)0x0)) {
      return pxVar1;
    }
    if ((((sysID != (xmlChar *)0x0) && (catal->sgml != (xmlHashTablePtr)0x0)) &&
        (pvVar2 = xmlHashLookup(catal->sgml,sysID), pvVar2 != (void *)0x0)) &&
       (*(int *)((long)pvVar2 + 0x18) == 0xd)) {
      return *(xmlChar **)((long)pvVar2 + 0x30);
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

static const xmlChar *
xmlCatalogSGMLResolve(xmlCatalogPtr catal, const xmlChar *pubID,
	              const xmlChar *sysID) {
    const xmlChar *ret = NULL;

    if (catal->sgml == NULL)
	return(NULL);

    if (pubID != NULL)
	ret = xmlCatalogGetSGMLPublic(catal->sgml, pubID);
    if (ret != NULL)
	return(ret);
    if (sysID != NULL)
	ret = xmlCatalogGetSGMLSystem(catal->sgml, sysID);
    if (ret != NULL)
	return(ret);
    return(NULL);
}